

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

int __thiscall RandStrAltList::maxlen(RandStrAltList *this)

{
  int iVar1;
  int iVar2;
  RandStrNode *pRVar3;
  
  iVar2 = 0;
  for (pRVar3 = (this->super_RandStrNode).firstChild; pRVar3 != (RandStrNode *)0x0;
      pRVar3 = pRVar3->nextSibling) {
    iVar1 = (*pRVar3->_vptr_RandStrNode[2])(pRVar3);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

virtual int maxlen()
    {
        int lmax = 0;
        for (RandStrNode *chi = firstChild ; chi != 0 ; chi = chi->nextSibling)
        {
            int l = chi->maxlen();
            if (l > lmax)
                lmax = l;
        }

        return lmax;
    }